

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  ImVec2 IVar1;
  uint uVar2;
  ImVec2 IVar3;
  float fVar4;
  ImFontAtlasCustomRect *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    IVar3 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][2];
    pIVar5 = (this->CustomRects).Data + this->PackIdMouseCursors;
    uVar2._0_2_ = pIVar5->X;
    uVar2._2_2_ = pIVar5->Y;
    auVar9 = vpmovzxwd_avx(ZEXT416(uVar2));
    auVar9 = vcvtdq2ps_avx(auVar9);
    IVar1 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    auVar6._0_4_ = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].x + auVar9._0_4_;
    auVar6._4_4_ = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0].y + auVar9._4_4_;
    auVar6._8_4_ = auVar9._8_4_ + 0.0;
    auVar6._12_4_ = auVar9._12_4_ + 0.0;
    *out_size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_offset = IVar3;
    auVar9._0_4_ = auVar6._0_4_ * (this->TexUvScale).x;
    auVar9._4_4_ = auVar6._4_4_ * (this->TexUvScale).y;
    auVar9._8_4_ = auVar6._8_4_ * 0.0;
    auVar9._12_4_ = auVar6._12_4_ * 0.0;
    IVar3 = (ImVec2)vmovlps_avx(auVar9);
    *out_uv_border = IVar3;
    fVar4 = IVar1.x;
    auVar10._0_4_ = auVar6._0_4_ + fVar4;
    auVar10._4_4_ = auVar6._4_4_ + IVar1.y;
    auVar10._8_4_ = auVar6._8_4_ + 0.0;
    auVar10._12_4_ = auVar6._12_4_ + 0.0;
    auVar11._0_4_ = auVar10._0_4_ * (this->TexUvScale).x;
    auVar11._4_4_ = auVar10._4_4_ * (this->TexUvScale).y;
    auVar11._8_4_ = auVar10._8_4_ * 0.0;
    auVar11._12_4_ = auVar10._12_4_ * 0.0;
    IVar1 = (ImVec2)vmovlps_avx(auVar11);
    out_uv_border[1] = IVar1;
    auVar9 = vblendps_avx(ZEXT416((uint)(auVar6._0_4_ + 123.0)),auVar6,2);
    auVar7._0_4_ = auVar9._0_4_ * (this->TexUvScale).x;
    auVar7._4_4_ = auVar9._4_4_ * (this->TexUvScale).y;
    auVar7._8_4_ = auVar9._8_4_ * 0.0;
    auVar7._12_4_ = auVar9._12_4_ * 0.0;
    IVar1 = (ImVec2)vmovlps_avx(auVar7);
    *out_uv_fill = IVar1;
    auVar9 = vblendps_avx(ZEXT416((uint)(auVar6._0_4_ + 123.0 + fVar4)),auVar10,2);
    auVar8._0_4_ = auVar9._0_4_ * (this->TexUvScale).x;
    auVar8._4_4_ = auVar9._4_4_ * (this->TexUvScale).y;
    auVar8._8_4_ = auVar9._8_4_ * 0.0;
    auVar8._12_4_ = auVar9._12_4_ * 0.0;
    IVar1 = (ImVec2)vmovlps_avx(auVar8);
    out_uv_fill[1] = IVar1;
    return true;
  }
  return false;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(PackIdMouseCursors != -1);
    ImFontAtlasCustomRect* r = GetCustomRectByIndex(PackIdMouseCursors);
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r->X, (float)r->Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}